

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_dwt_encode_v_func(void *user_data,opj_tls_t *tls)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)((long)user_data + 0x28);
  uVar2 = *(uint *)((long)user_data + 0x2c);
  uVar3 = uVar1;
  if (uVar1 + 7 < uVar2) {
    do {
      uVar1 = uVar3 + 8;
      (**(code **)((long)user_data + 0x30))
                ((ulong)uVar3 * 4 + *(long *)((long)user_data + 0x20),*user_data,
                 *(undefined4 *)((long)user_data + 0x18),*(int *)((long)user_data + 0x10) == 0,
                 *(undefined4 *)((long)user_data + 0x1c),8);
      uVar2 = *(uint *)((long)user_data + 0x2c);
      uVar4 = uVar3 + 0xf;
      uVar3 = uVar1;
    } while (uVar4 < uVar2);
  }
  if (uVar1 < uVar2) {
    (**(code **)((long)user_data + 0x30))
              ((ulong)uVar1 * 4 + *(long *)((long)user_data + 0x20),*user_data,
               *(undefined4 *)((long)user_data + 0x18),*(int *)((long)user_data + 0x10) == 0,
               *(undefined4 *)((long)user_data + 0x1c));
  }
  opj_aligned_free(*user_data);
  opj_free(user_data);
  return;
}

Assistant:

static void opj_dwt_encode_v_func(void* user_data, opj_tls_t* tls)
{
    OPJ_UINT32 j;
    opj_dwt_encode_v_job_t* job;
    (void)tls;

    job = (opj_dwt_encode_v_job_t*)user_data;
    for (j = job->min_j; j + NB_ELTS_V8 - 1 < job->max_j; j += NB_ELTS_V8) {
        (*job->p_encode_and_deinterleave_v)(job->tiledp + j,
                                            job->v.mem,
                                            job->rh,
                                            job->v.cas == 0,
                                            job->w,
                                            NB_ELTS_V8);
    }
    if (j < job->max_j) {
        (*job->p_encode_and_deinterleave_v)(job->tiledp + j,
                                            job->v.mem,
                                            job->rh,
                                            job->v.cas == 0,
                                            job->w,
                                            job->max_j - j);
    }

    opj_aligned_free(job->v.mem);
    opj_free(job);
}